

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::Synchronize(WastParser *this,SynchronizeFunc *func)

{
  uint uVar1;
  bool bVar2;
  TokenType TVar3;
  TokenType TVar4;
  uint uVar5;
  TokenTypePair TVar6;
  TokenTypePair TVar7;
  Enum EVar8;
  Token token;
  string local_90;
  Token local_70;
  
  EVar8 = Ok;
  TVar3 = Peek(this,0);
  TVar4 = Peek(this,1);
  TVar6._M_elems[1] = TVar4;
  TVar6._M_elems[0] = TVar3;
  bVar2 = (*func)(TVar6);
  if (!bVar2) {
    uVar1 = 0;
    do {
      uVar5 = uVar1;
      Consume(&local_70,this);
      if (local_70.token_type_ == Reserved) {
        Token::to_string_clamp_abi_cxx11_(&local_90,&local_70,0x50);
        Error(this,0x199aac,local_90._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      if (uVar5 == 9) break;
      TVar3 = Peek(this,0);
      TVar4 = Peek(this,1);
      TVar7._M_elems[1] = TVar4;
      TVar7._M_elems[0] = TVar3;
      bVar2 = (*func)(TVar7);
      uVar1 = uVar5 + 1;
    } while (!bVar2);
    EVar8 = (Enum)(8 < uVar5);
  }
  return (Result)EVar8;
}

Assistant:

Result WastParser::Synchronize(SynchronizeFunc func) {
  static const int kMaxConsumed = 10;
  for (int i = 0; i < kMaxConsumed; ++i) {
    if (func(PeekPair())) {
      return Result::Ok;
    }

    Token token = Consume();
    if (token.token_type() == TokenType::Reserved) {
      Error(token.loc, "unexpected token %s.",
            token.to_string_clamp(kMaxErrorTokenLength).c_str());
    }
  }

  return Result::Error;
}